

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O2

void __thiscall btShapeHull::~btShapeHull(btShapeHull *this)

{
  btAlignedObjectArray<unsigned_int>::clear(&this->m_indices);
  btAlignedObjectArray<btVector3>::clear(&this->m_vertices);
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&this->m_indices);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&this->m_vertices);
  return;
}

Assistant:

btShapeHull::~btShapeHull ()
{
	m_indices.clear();	
	m_vertices.clear ();
}